

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_script.c
# Opt level: O1

void ngx_http_script_full_name_code(ngx_http_script_engine_t *e)

{
  ngx_log_t *log;
  ngx_int_t nVar1;
  undefined1 auStack_20 [8];
  ngx_str_t value;
  
  value.len = (size_t)(e->buf).data;
  auStack_20 = (undefined1  [8])((long)e->pos - value.len);
  nVar1 = ngx_get_full_name(e->request->pool,&ngx_cycle->conf_prefix + (*(long *)(e->ip + 8) == 0),
                            (ngx_str_t *)auStack_20);
  if (nVar1 == 0) {
    *(undefined4 *)&(e->buf).len = auStack_20._0_4_;
    *(undefined4 *)((long)&(e->buf).len + 4) = auStack_20._4_4_;
    *(undefined4 *)&(e->buf).data = (undefined4)value.len;
    *(undefined4 *)((long)&(e->buf).data + 4) = value.len._4_4_;
    log = e->request->connection->log;
    if ((log->log_level & 0x100) != 0) {
      ngx_log_error_core(8,log,0,"http script fullname: \"%V\"",auStack_20);
    }
    e->ip = e->ip + 0x10;
  }
  else {
    e->ip = (u_char *)&ngx_http_script_exit_code;
    e->status = 500;
  }
  return;
}

Assistant:

static void
ngx_http_script_full_name_code(ngx_http_script_engine_t *e)
{
    ngx_http_script_full_name_code_t  *code;

    ngx_str_t  value, *prefix;

    code = (ngx_http_script_full_name_code_t *) e->ip;

    value.data = e->buf.data;
    value.len = e->pos - e->buf.data;

    prefix = code->conf_prefix ? (ngx_str_t *) &ngx_cycle->conf_prefix:
                                 (ngx_str_t *) &ngx_cycle->prefix;

    if (ngx_get_full_name(e->request->pool, prefix, &value) != NGX_OK) {
        e->ip = ngx_http_script_exit;
        e->status = NGX_HTTP_INTERNAL_SERVER_ERROR;
        return;
    }

    e->buf = value;

    ngx_log_debug1(NGX_LOG_DEBUG_HTTP, e->request->connection->log, 0,
                   "http script fullname: \"%V\"", &value);

    e->ip += sizeof(ngx_http_script_full_name_code_t);
}